

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O0

void drawVertex(btIDebugDraw *idraw,btVector3 *x,btScalar s,btVector3 *c)

{
  long *plVar1;
  undefined8 in_RDX;
  btVector3 *in_RSI;
  long *in_RDI;
  btVector3 *this;
  btVector3 *in_stack_fffffffffffffe80;
  btScalar local_110;
  btScalar local_10c;
  btVector3 local_108;
  btScalar local_f8 [4];
  btScalar local_e8;
  btScalar local_e4;
  btVector3 local_e0;
  btScalar local_d0 [4];
  btScalar local_c0;
  btScalar local_bc;
  btVector3 local_b8;
  btScalar local_a8 [4];
  btScalar local_98;
  btScalar local_94;
  btVector3 local_90;
  btScalar local_80 [4];
  btScalar local_70;
  btScalar local_6c;
  btVector3 local_68;
  btScalar local_58 [4];
  btScalar local_48;
  btScalar local_44;
  btVector3 local_40;
  btScalar local_30 [4];
  undefined8 local_20;
  btScalar local_14;
  btVector3 *local_10;
  long *local_8;
  
  local_44 = 0.0;
  local_48 = 0.0;
  this = &local_40;
  local_20 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  btVector3::btVector3(this,&local_14,&local_44,&local_48);
  local_30 = (btScalar  [4])operator-(in_stack_fffffffffffffe80,this);
  local_6c = 0.0;
  local_70 = 0.0;
  btVector3::btVector3(&local_68,&local_14,&local_6c,&local_70);
  local_58 = (btScalar  [4])operator+(local_10,this);
  (**(code **)(*in_RDI + 0x20))(in_RDI,local_30,local_58,local_20);
  plVar1 = local_8;
  local_94 = 0.0;
  local_98 = 0.0;
  btVector3::btVector3(&local_90,&local_94,&local_14,&local_98);
  local_80 = (btScalar  [4])operator-(local_10,this);
  local_bc = 0.0;
  local_c0 = 0.0;
  btVector3::btVector3(&local_b8,&local_bc,&local_14,&local_c0);
  local_a8 = (btScalar  [4])operator+(local_10,this);
  (**(code **)(*plVar1 + 0x20))(plVar1,local_80,local_a8,local_20);
  local_e4 = 0.0;
  local_e8 = 0.0;
  btVector3::btVector3(&local_e0,&local_e4,&local_e8,&local_14);
  local_d0 = (btScalar  [4])operator-(local_10,this);
  local_10c = 0.0;
  local_110 = 0.0;
  btVector3::btVector3(&local_108,&local_10c,&local_110,&local_14);
  local_f8 = (btScalar  [4])operator+(local_10,this);
  (**(code **)(*local_8 + 0x20))(local_8,local_d0,local_f8,local_20);
  return;
}

Assistant:

static void				drawVertex(	btIDebugDraw* idraw,
								   const btVector3& x,btScalar s,const btVector3& c)
{
	idraw->drawLine(x-btVector3(s,0,0),x+btVector3(s,0,0),c);
	idraw->drawLine(x-btVector3(0,s,0),x+btVector3(0,s,0),c);
	idraw->drawLine(x-btVector3(0,0,s),x+btVector3(0,0,s),c);
}